

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::Members::Members(Members *this)

{
  _Rb_tree_header *p_Var1;
  
  QPDFLogger::defaultLogger();
  (this->message_prefix)._M_dataplus._M_p = (pointer)&(this->message_prefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->message_prefix,"qpdf","");
  this->warnings = false;
  this->encryption_status = 0;
  this->verbose = false;
  this->split_pages = 0;
  this->progress = false;
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
   7) = 0;
  *(undefined8 *)&(this->progress_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->progress_handler).super__Function_base._M_functor + 8) = 0;
  (this->progress_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->progress_handler)._M_invoker = (_Invoker_type)0x0;
  *(undefined4 *)((long)&(this->progress_handler)._M_invoker + 7) = 0;
  (this->encryption_file)._M_dataplus._M_p = (pointer)&(this->encryption_file).field_2;
  (this->encryption_file)._M_string_length = 0;
  (this->encryption_file).field_2._M_local_buf[0] = '\0';
  (this->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 7) = 0;
  this->password_mode = pm_auto;
  this->allow_insecure = false;
  this->allow_weak_crypto = false;
  (this->user_password)._M_dataplus._M_p = (pointer)&(this->user_password).field_2;
  (this->user_password)._M_string_length = 0;
  (this->user_password).field_2._M_local_buf[0] = '\0';
  (this->owner_password)._M_dataplus._M_p = (pointer)&(this->owner_password).field_2;
  (this->owner_password)._M_string_length = 0;
  (this->owner_password).field_2._M_local_buf[0] = '\0';
  this->keylen = 0;
  this->r2_print = true;
  this->r2_modify = true;
  this->r2_extract = true;
  this->r2_annotate = true;
  this->r3_accessibility = true;
  this->r3_extract = true;
  this->r3_assemble = true;
  this->r3_annotate_and_form = true;
  this->r3_form_filling = true;
  this->r3_modify_other = true;
  this->stream_data_set = false;
  this->r3_print = qpdf_r3p_full;
  this->force_V4 = false;
  this->force_R5 = false;
  this->cleartext_metadata = false;
  this->use_aes = false;
  this->stream_data_mode = qpdf_s_compress;
  this->compress_streams = true;
  this->compress_streams_set = false;
  this->recompress_flate = false;
  this->recompress_flate_set = false;
  this->compression_level = -1;
  this->jpeg_quality = -1;
  this->decode_level = qpdf_dl_generalized;
  this->decode_level_set = false;
  this->normalize_set = false;
  this->normalize = false;
  this->suppress_recovery = false;
  this->object_stream_set = false;
  this->object_stream_mode = qpdf_o_preserve;
  this->ignore_xref_streams = false;
  this->qdf_mode = false;
  this->preserve_unreferenced_objects = false;
  this->remove_unreferenced_page_resources = re_auto;
  this->keep_files_open = true;
  this->keep_files_open_set = false;
  this->keep_files_open_threshold = 200;
  this->newline_before_endstream = false;
  (this->linearize_pass1)._M_dataplus._M_p = (pointer)&(this->linearize_pass1).field_2;
  (this->linearize_pass1)._M_string_length = 0;
  (this->linearize_pass1).field_2._M_local_buf[0] = '\0';
  this->coalesce_contents = false;
  this->flatten_annotations = false;
  this->flatten_annotations_required = 0;
  this->flatten_annotations_forbidden = 3;
  this->generate_appearances = false;
  (this->max_input_version).major_version = 0;
  (this->max_input_version).minor_version = 0;
  (this->max_input_version).extension_level = 0;
  (this->min_version)._M_dataplus._M_p = (pointer)&(this->min_version).field_2;
  (this->min_version)._M_string_length = 0;
  (this->min_version).field_2._M_local_buf[0] = '\0';
  (this->force_version)._M_dataplus._M_p = (pointer)&(this->force_version).field_2;
  (this->force_version)._M_string_length = 0;
  (this->force_version).field_2._M_local_buf[0] = '\0';
  this->check_linearization = false;
  this->show_linearization = false;
  this->show_xref = false;
  this->show_trailer = false;
  this->show_npages = false;
  this->deterministic_id = false;
  this->static_id = false;
  this->static_aes_iv = false;
  this->suppress_original_object_id = false;
  this->show_encryption = false;
  this->show_encryption_key = false;
  this->check_linearization = false;
  *(undefined8 *)
   ((long)&(this->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  this->show_obj = 0;
  this->show_gen = 0;
  *(undefined8 *)&this->show_raw_stream_data = 0;
  (this->attachment_to_show)._M_dataplus._M_p = (pointer)&(this->attachment_to_show).field_2;
  (this->attachment_to_show)._M_string_length = 0;
  (this->attachment_to_show).field_2._M_local_buf[0] = '\0';
  (this->attachments_to_remove).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->attachments_to_remove;
  (this->attachments_to_remove).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->attachments_to_remove;
  (this->attachments_to_remove).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->attachments_to_add).
  super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->attachments_to_add;
  (this->attachments_to_add).
  super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->attachments_to_add;
  (this->attachments_to_add).
  super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>._M_impl._M_node.
  _M_size = 0;
  (this->attachments_to_copy).
  super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->attachments_to_copy;
  (this->attachments_to_copy).
  super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->attachments_to_copy;
  (this->attachments_to_copy).
  super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>.
  _M_impl._M_node._M_size = 0;
  this->json_version = 0;
  p_Var1 = &(this->json_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->json_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->json_objects)._M_t._M_impl.super__Rb_tree_header;
  (this->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->json_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->json_stream_data = qpdf_sj_none;
  this->json_stream_data_set = false;
  (this->json_stream_prefix)._M_dataplus._M_p = (pointer)&(this->json_stream_prefix).field_2;
  (this->json_stream_prefix)._M_string_length = 0;
  (this->json_stream_prefix).field_2._M_local_buf[0] = '\0';
  this->remove_structure = false;
  this->test_json_schema = false;
  this->check = false;
  this->optimize_images = false;
  this->externalize_inline_images = false;
  this->keep_inline_images = false;
  this->remove_info = false;
  this->remove_metadata = false;
  this->remove_page_labels = false;
  this->oi_min_width = 0x80;
  this->oi_min_height = 0x80;
  this->oi_min_area = 0x4000;
  this->ii_min_bytes = 0x400;
  p_Var1 = &(this->rotations)._M_t._M_impl.super__Rb_tree_header;
  (this->rotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->underlay).super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->underlay).super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->underlay).super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->overlay).super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->overlay).super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->overlay).super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->under_overlay = (UnderOverlay *)0x0;
  (this->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rotations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->require_outfile = true;
  this->replace_input = false;
  this->check_is_encrypted = false;
  this->check_requires_password = false;
  (this->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->json_input = false;
  this->json_output = false;
  (this->update_from_json)._M_dataplus._M_p = (pointer)&(this->update_from_json).field_2;
  (this->update_from_json)._M_string_length = 0;
  (this->update_from_json).field_2._M_local_buf[0] = '\0';
  this->report_mem_usage = false;
  (this->page_label_specs).
  super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->page_label_specs).
  super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->page_label_specs).
  super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

QPDFJob::Members::Members() :
    log(QPDFLogger::defaultLogger())
{
}